

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O1

void GetEntropyUnrefined_C(uint32_t *X,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint32_t uVar9;
  bool bVar10;
  
  uVar6 = *X;
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  stats->streaks[1] = (int  [2])0x0;
  bit_entropy->entropy = 0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffffffff;
  if (length < 2) {
    uVar8 = 1;
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    uVar8 = 1;
    do {
      uVar2 = X[uVar8];
      if (uVar2 != uVar6) {
        uVar4 = (uint32_t)uVar8;
        if (uVar6 != 0) {
          bit_entropy->sum = bit_entropy->sum + (uVar4 - uVar9) * uVar6;
          bit_entropy->nonzeros = (bit_entropy->nonzeros + uVar4) - uVar9;
          bit_entropy->nonzero_code = uVar9;
          if (uVar6 < 0x100) {
            uVar5 = kSLog2Table[uVar6];
          }
          else {
            uVar5 = (*VP8LFastSLog2Slow)(uVar6);
          }
          bit_entropy->entropy = bit_entropy->entropy + (uVar8 - (long)(int)uVar9) * uVar5;
          if (bit_entropy->max_val < uVar6) {
            bit_entropy->max_val = uVar6;
          }
        }
        bVar3 = 3 < (int)(uVar4 - uVar9);
        bVar10 = uVar6 != 0;
        stats->counts[bVar10] = stats->counts[bVar10] + (uint)bVar3;
        stats->streaks[bVar10][bVar3] = (stats->streaks[bVar10][bVar3] - uVar9) + uVar4;
        uVar6 = uVar2;
        uVar9 = uVar4;
      }
      uVar8 = uVar8 + 1;
    } while ((uint)length != uVar8);
  }
  iVar7 = (int)uVar8 - uVar9;
  if (uVar6 != 0) {
    bit_entropy->sum = bit_entropy->sum + iVar7 * uVar6;
    bit_entropy->nonzeros = bit_entropy->nonzeros + iVar7;
    bit_entropy->nonzero_code = uVar9;
    if (uVar6 < 0x100) {
      uVar5 = kSLog2Table[uVar6];
    }
    else {
      uVar5 = (*VP8LFastSLog2Slow)(uVar6);
    }
    bit_entropy->entropy = bit_entropy->entropy + (long)iVar7 * uVar5;
    if (bit_entropy->max_val < uVar6) {
      bit_entropy->max_val = uVar6;
    }
  }
  stats->counts[uVar6 != 0] = stats->counts[uVar6 != 0] + (uint)(3 < iVar7);
  piVar1 = stats->streaks[uVar6 != 0] + (3 < iVar7);
  *piVar1 = *piVar1 + iVar7;
  uVar6 = bit_entropy->sum;
  if ((ulong)uVar6 < 0x100) {
    uVar5 = kSLog2Table[uVar6];
  }
  else {
    uVar5 = (*VP8LFastSLog2Slow)(uVar6);
  }
  bit_entropy->entropy = uVar5 - bit_entropy->entropy;
  return;
}

Assistant:

static void GetEntropyUnrefined_C(
    const uint32_t X[], int length,
    VP8LBitEntropy* WEBP_RESTRICT const bit_entropy,
    VP8LStreaks* WEBP_RESTRICT const stats) {
  int i;
  int i_prev = 0;
  uint32_t x_prev = X[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t x = X[i];
    if (x != x_prev) {
      GetEntropyUnrefinedHelper(x, i, &x_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &x_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy = VP8LFastSLog2(bit_entropy->sum) - bit_entropy->entropy;
}